

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-mock-test.cc
# Opt level: O3

void __thiscall
BufferedFileTest_CloseNoRetryInDtor_Test::TestBody(BufferedFileTest_CloseNoRetryInDtor_Test *this)

{
  bool bVar1;
  int iVar2;
  buffered_file *this_00;
  long *plVar3;
  AssertionResult *pAVar4;
  size_type *psVar5;
  undefined1 *__s1;
  char *pcVar6;
  string_view message;
  file read_end;
  int saved_fclose_count;
  file write_end;
  string gtest_output;
  AssertionResult gtest_ar;
  string gtest_expected_output;
  scoped_ptr<fmt::v5::buffered_file> f;
  OutputRedirect gtest_redir;
  file local_94;
  int local_90;
  file local_8c;
  string local_88;
  AssertionResult local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  scoped_ptr<fmt::v5::buffered_file> local_38;
  OutputRedirect local_30;
  
  local_94.fd_ = -1;
  local_8c.fd_ = -1;
  fmt::v5::file::pipe(&local_94,&local_8c.fd_);
  this_00 = (buffered_file *)operator_new(8);
  fmt::v5::file::fdopen((file *)this_00,(int)&local_94,"r");
  local_90 = 0;
  local_38.ptr_ = this_00;
  testing::AssertionSuccess();
  if (local_68.success_ == true) {
    message.size_ = 0x11;
    message.data_ = "cannot close file";
    format_system_error_abi_cxx11_(&local_88,4,message);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_58.field_2._M_allocated_capacity = *psVar5;
      local_58.field_2._8_8_ = plVar3[3];
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    }
    else {
      local_58.field_2._M_allocated_capacity = *psVar5;
      local_58._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_58._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_) !=
        &local_88.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_));
    }
    OutputRedirect::OutputRedirect(&local_30,_stderr);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (anonymous_namespace)::fclose_count = 1;
      testing::internal::scoped_ptr<fmt::v5::buffered_file>::reset(&local_38,(buffered_file *)0x0);
      local_90 = (anonymous_namespace)::fclose_count;
      (anonymous_namespace)::fclose_count = 0;
    }
    OutputRedirect::restore_and_read_abi_cxx11_(&local_88,&local_30);
    if (local_88._M_string_length == local_58._M_string_length) {
      bVar1 = true;
      __s1 = (undefined1 *)CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_)
      ;
      if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
        iVar2 = bcmp(__s1,local_58._M_dataplus._M_p,local_88._M_string_length);
        if (iVar2 != 0) goto LAB_0010fcac;
      }
    }
    else {
LAB_0010fcac:
      pAVar4 = testing::AssertionResult::operator<<
                         (&local_68,
                          (char (*) [121])
                          "{ fclose_count = 1; f.reset(nullptr); saved_fclose_count = fclose_count; fclose_count = 0; } produces different output.\n"
                         );
      pAVar4 = testing::AssertionResult::operator<<(pAVar4,(char (*) [11])0x165ab5);
      pAVar4 = testing::AssertionResult::operator<<(pAVar4,&local_58);
      pAVar4 = testing::AssertionResult::operator<<(pAVar4,(char (*) [2])0x166180);
      pAVar4 = testing::AssertionResult::operator<<(pAVar4,(char (*) [11])0x165aa9);
      testing::AssertionResult::operator<<(pAVar4,&local_88);
      __s1 = (undefined1 *)CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_)
      ;
      bVar1 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__s1 != &local_88.field_2) {
      operator_delete(__s1);
    }
    OutputRedirect::~OutputRedirect(&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if (bVar1) goto LAB_0010fdb0;
  }
  testing::Message::Message((Message *)&local_58);
  if (local_68.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar6 = "";
  }
  else {
    pcVar6 = ((local_68.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_88,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/posix-mock-test.cc"
             ,0x198,pcVar6);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_58);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_58._M_dataplus._M_p + 8))();
    }
  }
LAB_0010fdb0:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_88._M_dataplus._M_p._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_58,"2","saved_fclose_count",(int *)&local_88,&local_90);
  if ((char)local_58._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_88);
    if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_58._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/posix-mock-test.cc"
               ,0x199,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_88._M_dataplus._M_p._4_4_,
                                       local_88._M_dataplus._M_p._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::scoped_ptr<fmt::v5::buffered_file>::reset(&local_38,(buffered_file *)0x0);
  fmt::v5::file::~file(&local_8c);
  fmt::v5::file::~file(&local_94);
  return;
}

Assistant:

TEST(BufferedFileTest, CloseNoRetryInDtor) {
  file read_end, write_end;
  file::pipe(read_end, write_end);
  scoped_ptr<buffered_file> f(new buffered_file(read_end.fdopen("r")));
  int saved_fclose_count = 0;
  EXPECT_WRITE(stderr, {
    fclose_count = 1;
    f.reset(FMT_NULL);
    saved_fclose_count = fclose_count;
    fclose_count = 0;
  }, format_system_error(EINTR, "cannot close file") + "\n");
  EXPECT_EQ(2, saved_fclose_count);
}